

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::KillLocationAndComponentDecorations
          (InterfaceVariableScalarReplacement *this,uint32_t var_id)

{
  DecorationManager *this_00;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = IRContext::get_decoration_mgr((this->super_Pass).context_);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp:234:15)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp:234:15)>
             ::_M_manager;
  analysis::DecorationManager::RemoveDecorationsFrom
            (this_00,var_id,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::KillLocationAndComponentDecorations(
    uint32_t var_id) {
  context()->get_decoration_mgr()->RemoveDecorationsFrom(
      var_id, [](const Instruction& inst) {
        spv::Decoration decoration = spv::Decoration(
            inst.GetSingleWordInOperand(kOpDecorateDecorationInOperandIndex));
        return decoration == spv::Decoration::Location ||
               decoration == spv::Decoration::Component;
      });
}